

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::arg_list(analysis *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  analysis *in_RSI;
  NodePtr NVar3;
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  NodePtr tmp_ptr;
  allocator local_41;
  string local_40 [32];
  int local_20;
  byte local_19;
  analysis *this_local;
  NodePtr *ret;
  
  local_19 = 0;
  this_local = this;
  this_00 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &in_RSI->tmp);
  local_20 = token::getLineno(this_00);
  std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])this,(int *)0x162420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"(",&local_41);
  match(in_RSI,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<dh::TreeNode>::shared_ptr
            ((shared_ptr<dh::TreeNode> *)(local_88 + 0x20),(nullptr_t)0x0);
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_((token *)local_88);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,")");
  std::__cxx11::string::~string((string *)local_88);
  if (bVar1) {
    proper_arg_list((analysis *)local_98);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)(local_88 + 0x20),(shared_ptr<dh::TreeNode> *)local_98);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_98);
  }
  this_01 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  TreeNode::appendChild(this_01,(NodePtr *)(local_88 + 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,")",&local_b9);
  match(in_RSI,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_19 = 1;
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)(local_88 + 0x20));
  _Var2._M_pi = extraout_RDX;
  if ((local_19 & 1) == 0) {
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::arg_list()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in arg_list\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("()",tmp->getLineno());
	match("(");
	NodePtr tmp_ptr = nullptr;
	if ( tmp->getVal() != ")")
	{
		tmp_ptr = proper_arg_list();
	}
	ret->appendChild(tmp_ptr);
	match(")");
	return ret;
}